

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

void __thiscall
duckdb::ReservoirSamplePercentage::AddToReservoir(ReservoirSamplePercentage *this,DataChunk *input)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true> *__args;
  idx_t count;
  idx_t iVar1;
  ulong uVar2;
  Allocator *allocator;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint32_t uVar6;
  pointer pBVar7;
  idx_t count_p;
  pointer pRVar8;
  SelectionVector *sel;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> this_01;
  long lVar9;
  ulong uVar10;
  idx_t i;
  undefined1 auVar11 [16];
  int iVar12;
  undefined1 auVar13 [16];
  DataChunk new_chunk;
  DataChunk local_88;
  vector<duckdb::LogicalType,_true> local_48;
  
  iVar1 = input->count;
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  pBVar7->num_entries_seen_total = pBVar7->num_entries_seen_total + iVar1;
  iVar1 = this->current_count;
  uVar2 = input->count;
  if (uVar2 + iVar1 < 0x186a1) {
    this->current_count = uVar2 + iVar1;
    pRVar8 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->(&this->current_sample);
    (*(pRVar8->super_BlockingSample)._vptr_BlockingSample[2])(pRVar8,input);
    return;
  }
  count_p = -(iVar1 - 100000);
  if (iVar1 - 100000 != 0) {
    if (uVar2 == count_p) {
      DataChunk::Flatten(input);
      input->count = uVar2;
      pRVar8 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
               ::operator->(&this->current_sample);
      (*(pRVar8->super_BlockingSample)._vptr_BlockingSample[2])(pRVar8,input);
    }
    else {
      DataChunk::DataChunk(&local_88);
      DataChunk::GetTypes(&local_48,input);
      DataChunk::InitializeEmpty(&local_88,&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
      sel = FlatVector::IncrementalSelectionVector();
      DataChunk::Slice(&local_88,input,sel,count_p,0);
      DataChunk::Flatten(&local_88);
      pRVar8 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
               ::operator->(&this->current_sample);
      (*(pRVar8->super_BlockingSample)._vptr_BlockingSample[2])(pRVar8,&local_88);
      DataChunk::~DataChunk(&local_88);
    }
  }
  count = uVar2 + (iVar1 - 100000);
  if (uVar2 != count_p) {
    SelectionVector::SelectionVector((SelectionVector *)&local_88,count);
    auVar5 = _DAT_01d84390;
    auVar4 = _DAT_01d84380;
    if (count_p < uVar2) {
      lVar9 = iVar1 + uVar2 + -0x186a1;
      auVar11._8_4_ = (int)lVar9;
      auVar11._0_8_ = lVar9;
      auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar10 = 0;
      auVar11 = auVar11 ^ _DAT_01d84390;
      do {
        iVar12 = (int)uVar10;
        auVar13._8_4_ = iVar12;
        auVar13._0_8_ = uVar10;
        auVar13._12_4_ = (int)(uVar10 >> 0x20);
        auVar13 = (auVar13 | auVar4) ^ auVar5;
        if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                    auVar11._4_4_ < auVar13._4_4_) & 1)) {
          *(int *)(&(local_88.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start)->vector_type + uVar10 * 4) =
               (100000 - (int)iVar1) + iVar12;
        }
        if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
            auVar13._12_4_ <= auVar11._12_4_) {
          *(int *)(&(local_88.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start)->field_0x4 + uVar10 * 4) =
               (0x186a1 - (int)iVar1) + iVar12;
        }
        uVar10 = uVar10 + 2;
      } while (((iVar1 + uVar2) - 99999 & 0xfffffffffffffffe) != uVar10);
    }
    DataChunk::Slice(input,(SelectionVector *)&local_88,count);
    if (local_88.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_88.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
  }
  __args = &this->current_sample;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
              *)&this->finished_samples,__args);
  allocator = this->allocator;
  pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  uVar6 = RandomEngine::NextRandomInteger((RandomEngine *)pBVar7);
  this_01._M_head_impl = (ReservoirSample *)operator_new(0x58);
  ReservoirSample::ReservoirSample
            (this_01._M_head_impl,allocator,this->reservoir_sample_size,(ulong)uVar6);
  _Var3._M_head_impl =
       (__args->
       super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
       .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl;
  (__args->super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl = this_01._M_head_impl;
  if (_Var3._M_head_impl != (ReservoirSample *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BlockingSample + 8))();
  }
  if (uVar2 != count_p) {
    pRVar8 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->(__args);
    (*(pRVar8->super_BlockingSample)._vptr_BlockingSample[2])(pRVar8,input);
  }
  this->current_count = count;
  return;
}

Assistant:

void ReservoirSamplePercentage::AddToReservoir(DataChunk &input) {
	base_reservoir_sample->num_entries_seen_total += input.size();
	if (current_count + input.size() > RESERVOIR_THRESHOLD) {
		// we don't have enough space in our current reservoir
		// first check what we still need to append to the current sample
		idx_t append_to_current_sample_count = RESERVOIR_THRESHOLD - current_count;
		idx_t append_to_next_sample = input.size() - append_to_current_sample_count;
		if (append_to_current_sample_count > 0) {
			// we have elements remaining, first add them to the current sample
			if (append_to_next_sample > 0) {
				// we need to also add to the next sample
				DataChunk new_chunk;
				new_chunk.InitializeEmpty(input.GetTypes());
				new_chunk.Slice(input, *FlatVector::IncrementalSelectionVector(), append_to_current_sample_count);
				new_chunk.Flatten();
				current_sample->AddToReservoir(new_chunk);
			} else {
				input.Flatten();
				input.SetCardinality(append_to_current_sample_count);
				current_sample->AddToReservoir(input);
			}
		}
		if (append_to_next_sample > 0) {
			// slice the input for the remainder
			SelectionVector sel(append_to_next_sample);
			for (idx_t i = append_to_current_sample_count; i < append_to_next_sample + append_to_current_sample_count;
			     i++) {
				sel.set_index(i - append_to_current_sample_count, i);
			}
			input.Slice(sel, append_to_next_sample);
		}
		// now our first sample is filled: append it to the set of finished samples
		finished_samples.push_back(std::move(current_sample));

		// allocate a new sample, and potentially add the remainder of the current input to that sample
		current_sample = make_uniq<ReservoirSample>(allocator, reservoir_sample_size, base_reservoir_sample->random());
		if (append_to_next_sample > 0) {
			current_sample->AddToReservoir(input);
		}
		current_count = append_to_next_sample;
	} else {
		// we can just append to the current sample
		current_count += input.size();
		current_sample->AddToReservoir(input);
	}
}